

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall
Lodtalk::ClassTable::addSpecialClass(ClassTable *this,ClassDescription *description,size_t index)

{
  reference ppOVar1;
  unsigned_long *puVar2;
  undefined1 *local_60;
  anon_union_8_4_0eb573b0_for_Oop_0 local_58;
  ulong local_40;
  size_t i;
  size_t elementIndex;
  size_t pageIndex;
  WriteLock<Lodtalk::SharedMutex> l;
  size_t index_local;
  ClassDescription *description_local;
  ClassTable *this_local;
  
  l.mutex = (SharedMutex *)index;
  WriteLock<Lodtalk::SharedMutex>::WriteLock
            ((WriteLock<Lodtalk::SharedMutex> *)&pageIndex,&this->sharedMutex);
  elementIndex = (ulong)l.mutex >> 9;
  i = (ulong)l.mutex & 0x1ff;
  for (local_40 = std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>::size
                            (&this->pageTable); local_40 < elementIndex + 1; local_40 = local_40 + 1
      ) {
    allocatePage(this);
  }
  local_58 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::fromPointer(description);
  ppOVar1 = std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>::operator[]
                      (&this->pageTable,elementIndex);
  (*ppOVar1)[i].field_0 = local_58;
  local_60 = (undefined1 *)((long)&((l.mutex)->mutex).super___mutex_base._M_mutex + 1);
  puVar2 = std::max<unsigned_long>(&this->size,(unsigned_long *)&local_60);
  this->size = *puVar2;
  (description->super_Behavior).super_Object.super_ProtoObject.object_header_ =
       (ObjectHeader)
       ((ulong)(description->super_Behavior).super_Object.super_ProtoObject.object_header_ &
        0xffffffff000003ff | ((ulong)l.mutex & 0x3fffff) << 10);
  WriteLock<Lodtalk::SharedMutex>::~WriteLock((WriteLock<Lodtalk::SharedMutex> *)&pageIndex);
  return;
}

Assistant:

void ClassTable::addSpecialClass(ClassDescription *description, size_t index)
{
    WriteLock<SharedMutex> l(sharedMutex);
    auto pageIndex = index / OopsPerPage;
    auto elementIndex = index % OopsPerPage;

    for(size_t i = pageTable.size(); i < pageIndex + 1; ++i)
        allocatePage();

    pageTable[pageIndex][elementIndex] = Oop::fromPointer(description);
    size = std::max(size, index + 1);
    description->object_header_.identityHash = (unsigned int)index;
}